

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFHighLevelEncoder.cpp
# Opt level: O1

int ZXing::Pdf417::EncodeText
              (wstring *msg,int startpos,int count,int submode,
              vector<int,_std::allocator<int>_> *output)

{
  wchar_t wVar1;
  wchar_t wVar2;
  pointer pwVar3;
  iterator iVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  int h;
  vector<int,_std::allocator<int>_> tmp;
  uint local_5c;
  vector<int,_std::allocator<int>_> local_58;
  int local_3c;
  undefined4 local_38;
  int local_34;
  
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_3c = count;
  std::vector<int,_std::allocator<int>_>::reserve(&local_58,(long)count);
  iVar9 = 0;
  do {
    pwVar3 = (msg->_M_dataplus)._M_p;
    wVar1 = pwVar3[startpos + iVar9];
    if (submode == 0) {
      local_5c = wVar1 + L'\xffffffbf';
      if (wVar1 == L' ' || local_5c < 0x1a) {
        if (wVar1 == L' ') {
          local_5c = 0x1a;
        }
        if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_58,
                     (iterator)
                     local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_5c);
        }
        else {
          *local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = local_5c;
LAB_0017dd31:
          local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
LAB_0017dd3a:
        submode = 0;
        goto LAB_0017de39;
      }
      if ((uint)(wVar1 + L'\xffffff9f') < 0x1a) {
        local_5c = 0x1b;
        if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_58,
                     (iterator)
                     local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_5c);
        }
        else {
LAB_0017daef:
          *local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = 0x1b;
          local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
LAB_0017dafe:
        submode = 1;
      }
      else {
        if ((0x7f < (uint)wVar1) || (MIXED[(uint)wVar1] == -1)) {
          local_5c = 0x1d;
          if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish ==
              local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_58,
                       (iterator)
                       local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)&local_5c);
          }
          else {
            *local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = 0x1d;
            local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          local_5c = (uint)(char)PUNCTUATION[wVar1];
          if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish !=
              local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage) {
            *local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = local_5c;
            goto LAB_0017dd31;
          }
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_58,
                     (iterator)
                     local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_5c);
          goto LAB_0017dd3a;
        }
        local_5c = 0x1c;
        if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_58,
                     (iterator)
                     local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_5c);
        }
        else {
LAB_0017db91:
          *local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = 0x1c;
          local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
LAB_0017ddb6:
        submode = 2;
      }
LAB_0017ddda:
      bVar5 = false;
    }
    else {
      if (submode == 1) {
        local_5c = wVar1 + L'\xffffff9f';
        if (wVar1 == L' ' || local_5c < 0x1a) {
          if (wVar1 == L' ') {
            local_5c = 0x1a;
          }
          if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish ==
              local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_58,
                       (iterator)
                       local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)&local_5c);
          }
          else {
            *local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = local_5c;
LAB_0017dcf0:
            local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          uVar8 = wVar1 + L'\xffffffbf';
          if (uVar8 < 0x1a) {
            local_5c = 0x1b;
            if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (&local_58,
                         (iterator)
                         local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)&local_5c);
            }
            else {
              *local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = 0x1b;
              local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
            }
            if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              *local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = uVar8;
              goto LAB_0017dcf0;
            }
            local_5c = uVar8;
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_58,
                       (iterator)
                       local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)&local_5c);
          }
          else {
            if (((uint)wVar1 < 0x80) && (MIXED[(uint)wVar1] != -1)) {
              local_5c = 0x1c;
              if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) goto LAB_0017db91;
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (&local_58,
                         (iterator)
                         local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)&local_5c);
              goto LAB_0017ddb6;
            }
            local_5c = 0x1d;
            if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (&local_58,
                         (iterator)
                         local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)&local_5c);
            }
            else {
              *local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = 0x1d;
              local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
            }
            local_5c = (uint)(char)PUNCTUATION[wVar1];
            if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              *local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = local_5c;
              goto LAB_0017dcf0;
            }
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_58,
                       (iterator)
                       local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)&local_5c);
          }
        }
        submode = 1;
      }
      else if (submode == 2) {
        if (((uint)wVar1 < 0x80) && (MIXED[(uint)wVar1] != -1)) {
          local_5c = (uint)(char)MIXED[wVar1];
          if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish ==
              local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_58,
                       (iterator)
                       local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)&local_5c);
          }
          else {
            *local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = local_5c;
            local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          submode = 2;
        }
        else {
          if (wVar1 == L' ' || (uint)(wVar1 + L'\xffffffbf') < 0x1a) {
            local_5c = 0x1c;
            if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              *local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = 0x1c;
              goto LAB_0017da52;
            }
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_58,
                       (iterator)
                       local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)&local_5c);
            goto LAB_0017dc69;
          }
          if ((uint)(wVar1 + L'\xffffff9f') < 0x1a) {
            local_5c = 0x1b;
            if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) goto LAB_0017daef;
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_58,
                       (iterator)
                       local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)&local_5c);
            goto LAB_0017dafe;
          }
          iVar6 = startpos + iVar9 + 1;
          submode = 2;
          if (iVar6 < local_3c) {
            wVar2 = pwVar3[iVar6];
            if ((ulong)(uint)wVar2 < 0x80) {
              local_38 = CONCAT31((int3)((uint)wVar2 >> 8),PUNCTUATION[(uint)wVar2] != -1);
            }
            else {
              local_38 = 0;
            }
            if ((char)local_38 != '\0') {
              local_5c = 0x19;
              if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&local_58,
                           (iterator)
                           local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(int *)&local_5c);
              }
              else {
                *local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = 0x19;
                local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              submode = 3;
            }
            if ((char)local_38 != '\0') goto LAB_0017ddda;
          }
          local_5c = 0x1d;
          if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish ==
              local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_58,
                       (iterator)
                       local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)&local_5c);
          }
          else {
            *local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = 0x1d;
            local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          local_5c = (uint)(char)PUNCTUATION[wVar1];
          if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish !=
              local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage) goto LAB_0017de2e;
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_58,
                     (iterator)
                     local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_5c);
        }
      }
      else {
        if ((0x7f < (uint)wVar1) || (PUNCTUATION[(uint)wVar1] == -1)) {
          local_5c = 0x1d;
          if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish ==
              local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_58,
                       (iterator)
                       local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)&local_5c);
          }
          else {
            *local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = 0x1d;
LAB_0017da52:
            local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
LAB_0017dc69:
          bVar5 = false;
          submode = 0;
          goto LAB_0017de44;
        }
        local_5c = (uint)(char)PUNCTUATION[wVar1];
        if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_58,
                     (iterator)
                     local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_5c);
        }
        else {
LAB_0017de2e:
          *local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = local_5c;
          local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)((uint *)local_58.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_finish + 1);
        }
      }
LAB_0017de39:
      iVar9 = iVar9 + 1;
      bVar5 = local_3c <= iVar9;
    }
LAB_0017de44:
    if (bVar5) {
      local_5c = 0;
      uVar10 = (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
      if (uVar10 != 0) {
        uVar7 = 0;
        do {
          if ((uVar7 & 1) == 0) {
            local_5c = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar7];
          }
          else {
            local_5c = local_5c * 0x1e +
                       local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar7];
            iVar4._M_current =
                 (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar4._M_current ==
                (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)output,iVar4,(int *)&local_5c);
            }
            else {
              *iVar4._M_current = local_5c;
              (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish = iVar4._M_current + 1;
            }
          }
          uVar7 = uVar7 + 1;
        } while (((long)uVar10 >> 2) + (ulong)((long)uVar10 >> 2 == 0) != uVar7);
      }
      if ((uVar10 & 4) != 0) {
        local_34 = local_5c * 0x1e + 0x1d;
        iVar4._M_current =
             (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_finish;
        if (iVar4._M_current ==
            (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(output,iVar4,&local_34);
        }
        else {
          *iVar4._M_current = local_34;
          (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = iVar4._M_current + 1;
        }
      }
      if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return submode;
    }
  } while( true );
}

Assistant:

static int EncodeText(const std::wstring& msg, int startpos, int count, int submode, std::vector<int>& output)
{
	std::vector<int> tmp;
	tmp.reserve(count);
	int idx = 0;
	while (true) {
		int ch = msg[startpos + idx];
		switch (submode) {
		case SUBMODE_ALPHA:
			if (IsAlphaUpper(ch)) {
				tmp.push_back(ch == ' ' ? 26 : (ch - 65)); // space
			} else if (IsAlphaLower(ch)) {
				submode = SUBMODE_LOWER;
				tmp.push_back(27); // ll
				continue;
			} else if (IsMixed(ch)) {
				submode = SUBMODE_MIXED;
				tmp.push_back(28); // ml
				continue;
			} else {
				tmp.push_back(29); // ps
				tmp.push_back(PUNCTUATION[ch]);
			}
			break;
		case SUBMODE_LOWER:
			if (IsAlphaLower(ch)) {
				tmp.push_back(ch == ' ' ? 26 : (ch - 97)); // space
			} else if (IsAlphaUpper(ch)) {
				tmp.push_back(27); // as
				tmp.push_back(ch - 65);
				// space cannot happen here, it is also in "Lower"
			} else if (IsMixed(ch)) {
				submode = SUBMODE_MIXED;
				tmp.push_back(28); // ml
				continue;
			} else {
				tmp.push_back(29); // ps
				tmp.push_back(PUNCTUATION[ch]);
			}
			break;
		case SUBMODE_MIXED:
			if (IsMixed(ch)) {
				tmp.push_back(MIXED[ch]);
			} else if (IsAlphaUpper(ch)) {
				submode = SUBMODE_ALPHA;
				tmp.push_back(28); // al
				continue;
			} else if (IsAlphaLower(ch)) {
				submode = SUBMODE_LOWER;
				tmp.push_back(27); // ll
				continue;
			} else {
				if (startpos + idx + 1 < count) {
					int next = msg[startpos + idx + 1];
					if (IsPunctuation(next)) {
						submode = SUBMODE_PUNCTUATION;
						tmp.push_back(25); // pl
						continue;
					}
				}
				tmp.push_back(29); // ps
				tmp.push_back(PUNCTUATION[ch]);
			}
			break;
		default: // SUBMODE_PUNCTUATION
			if (IsPunctuation(ch)) {
				tmp.push_back(PUNCTUATION[ch]);
			} else {
				submode = SUBMODE_ALPHA;
				tmp.push_back(29); // al
				continue;
			}
		}
		idx++;
		if (idx >= count) {
			break;
		}
	}
	int h = 0;
	size_t len = tmp.size();
	for (size_t i = 0; i < len; i++) {
		bool odd = (i % 2) != 0;
		if (odd) {
			h = (h * 30) + tmp[i];
			output.push_back(h);
		}
		else {
			h = tmp[i];
		}
	}
	if ((len % 2) != 0) {
		output.push_back((h * 30) + 29); //ps
	}
	return submode;
}